

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall TestValueTestobjects::runTestCase(TestValueTestobjects *this)

{
  bool bVar1;
  undefined1 uVar2;
  Value *expr;
  Value *other;
  Value *this_00;
  char *in_RDI;
  bool did;
  Value got;
  Value *constObject;
  PredicateContext _minitest_Context_1;
  PredicateContext _minitest_Context;
  IsCheck checks;
  undefined4 in_stack_fffffffffffffbc8;
  uint in_stack_fffffffffffffbcc;
  Value *in_stack_fffffffffffffbd0;
  char *pcVar3;
  undefined4 in_stack_fffffffffffffbd8;
  undefined2 in_stack_fffffffffffffbdc;
  undefined1 in_stack_fffffffffffffbde;
  undefined1 in_stack_fffffffffffffbdf;
  Value *in_stack_fffffffffffffbe0;
  TestResult *result;
  Value *in_stack_fffffffffffffbe8;
  undefined7 in_stack_fffffffffffffbf0;
  undefined1 in_stack_fffffffffffffbf7;
  Value *in_stack_fffffffffffffc00;
  undefined8 in_stack_fffffffffffffc20;
  ValueType other_00;
  Value *in_stack_fffffffffffffc28;
  Value *in_stack_fffffffffffffc48;
  Value *this_01;
  uint line;
  Value *in_stack_fffffffffffffc70;
  Value *in_stack_fffffffffffffc78;
  TestResult *in_stack_fffffffffffffc80;
  IsCheck *in_stack_fffffffffffffc90;
  Value *in_stack_fffffffffffffc98;
  ValueTest *in_stack_fffffffffffffca0;
  char local_2c0 [576];
  char *local_80;
  undefined4 local_78 [2];
  char *local_70;
  undefined4 local_68;
  char *local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined4 local_48 [2];
  char *local_40;
  undefined4 local_38;
  char *local_30;
  undefined8 local_28;
  undefined8 local_20;
  IsCheck local_14;
  
  other_00 = (ValueType)((ulong)in_stack_fffffffffffffc20 >> 0x20);
  ValueTest::IsCheck::IsCheck(&local_14);
  local_14.isObject_ = true;
  local_48[0] = **(undefined4 **)(in_RDI + 8);
  local_40 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_38 = 0xa7;
  local_30 = "checkIs(emptyObject_, checks)";
  local_28 = 0;
  local_20 = 0;
  *(undefined4 **)(*(long *)(*(long *)(in_RDI + 8) + 8) + 0x20) = local_48;
  **(int **)(in_RDI + 8) = **(int **)(in_RDI + 8) + 1;
  *(undefined4 **)(*(long *)(in_RDI + 8) + 8) = local_48;
  ValueTest::checkIs(in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,in_stack_fffffffffffffc90);
  JsonTest::TestResult::popPredicateContext(*(TestResult **)(in_RDI + 8));
  local_78[0] = **(undefined4 **)(in_RDI + 8);
  local_70 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_68 = 0xa8;
  local_60 = "checkIs(object1_, checks)";
  local_58 = 0;
  local_50 = 0;
  *(undefined4 **)(*(long *)(*(long *)(in_RDI + 8) + 8) + 0x20) = local_78;
  **(int **)(in_RDI + 8) = **(int **)(in_RDI + 8) + 1;
  *(undefined4 **)(*(long *)(in_RDI + 8) + 8) = local_78;
  ValueTest::checkIs(in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,in_stack_fffffffffffffc90);
  JsonTest::TestResult::popPredicateContext(*(TestResult **)(in_RDI + 8));
  line = (uint)((ulong)*(undefined8 *)(in_RDI + 8) >> 0x20);
  Json::Value::type((Value *)(in_RDI + 0x60));
  JsonTest::checkEqual<Json::ValueType,Json::ValueType>
            ((TestResult *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0),
             (ValueType)((ulong)in_stack_fffffffffffffbe8 >> 0x20),
             (ValueType)in_stack_fffffffffffffbe8,(char *)in_stack_fffffffffffffbe0,
             CONCAT13(in_stack_fffffffffffffbdf,
                      CONCAT12(in_stack_fffffffffffffbde,in_stack_fffffffffffffbdc)),
             (char *)in_stack_fffffffffffffbd0);
  bVar1 = Json::Value::isConvertibleTo(in_stack_fffffffffffffc28,other_00);
  if (!bVar1) {
    JsonTest::TestResult::addFailure
              ((TestResult *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0),
               (char *)in_stack_fffffffffffffbe8,(uint)((ulong)in_stack_fffffffffffffbe0 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffbdf,
                                CONCAT16(in_stack_fffffffffffffbde,
                                         CONCAT24(in_stack_fffffffffffffbdc,
                                                  in_stack_fffffffffffffbd8))));
  }
  bVar1 = Json::Value::isConvertibleTo(in_stack_fffffffffffffc28,other_00);
  if (bVar1) {
    JsonTest::TestResult::addFailure
              ((TestResult *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0),
               (char *)in_stack_fffffffffffffbe8,(uint)((ulong)in_stack_fffffffffffffbe0 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffbdf,
                                CONCAT16(in_stack_fffffffffffffbde,
                                         CONCAT24(in_stack_fffffffffffffbdc,
                                                  in_stack_fffffffffffffbd8))));
  }
  bVar1 = Json::Value::isConvertibleTo(in_stack_fffffffffffffc28,other_00);
  if (!bVar1) {
    JsonTest::TestResult::addFailure
              ((TestResult *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0),
               (char *)in_stack_fffffffffffffbe8,(uint)((ulong)in_stack_fffffffffffffbe0 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffbdf,
                                CONCAT16(in_stack_fffffffffffffbde,
                                         CONCAT24(in_stack_fffffffffffffbdc,
                                                  in_stack_fffffffffffffbd8))));
  }
  bVar1 = Json::Value::isConvertibleTo(in_stack_fffffffffffffc28,other_00);
  if (bVar1) {
    JsonTest::TestResult::addFailure
              ((TestResult *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0),
               (char *)in_stack_fffffffffffffbe8,(uint)((ulong)in_stack_fffffffffffffbe0 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffbdf,
                                CONCAT16(in_stack_fffffffffffffbde,
                                         CONCAT24(in_stack_fffffffffffffbdc,
                                                  in_stack_fffffffffffffbd8))));
  }
  bVar1 = Json::Value::isConvertibleTo(in_stack_fffffffffffffc28,other_00);
  if (bVar1) {
    JsonTest::TestResult::addFailure
              ((TestResult *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0),
               (char *)in_stack_fffffffffffffbe8,(uint)((ulong)in_stack_fffffffffffffbe0 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffbdf,
                                CONCAT16(in_stack_fffffffffffffbde,
                                         CONCAT24(in_stack_fffffffffffffbdc,
                                                  in_stack_fffffffffffffbd8))));
  }
  bVar1 = Json::Value::isConvertibleTo(in_stack_fffffffffffffc28,other_00);
  if (bVar1) {
    JsonTest::TestResult::addFailure
              ((TestResult *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0),
               (char *)in_stack_fffffffffffffbe8,(uint)((ulong)in_stack_fffffffffffffbe0 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffbdf,
                                CONCAT16(in_stack_fffffffffffffbde,
                                         CONCAT24(in_stack_fffffffffffffbdc,
                                                  in_stack_fffffffffffffbd8))));
  }
  bVar1 = Json::Value::isConvertibleTo(in_stack_fffffffffffffc28,other_00);
  if (bVar1) {
    JsonTest::TestResult::addFailure
              ((TestResult *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0),
               (char *)in_stack_fffffffffffffbe8,(uint)((ulong)in_stack_fffffffffffffbe0 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffbdf,
                                CONCAT16(in_stack_fffffffffffffbde,
                                         CONCAT24(in_stack_fffffffffffffbdc,
                                                  in_stack_fffffffffffffbd8))));
  }
  bVar1 = Json::Value::isConvertibleTo(in_stack_fffffffffffffc28,other_00);
  if (bVar1) {
    JsonTest::TestResult::addFailure
              ((TestResult *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0),
               (char *)in_stack_fffffffffffffbe8,(uint)((ulong)in_stack_fffffffffffffbe0 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffbdf,
                                CONCAT16(in_stack_fffffffffffffbde,
                                         CONCAT24(in_stack_fffffffffffffbdc,
                                                  in_stack_fffffffffffffbd8))));
  }
  bVar1 = Json::Value::isConvertibleTo(in_stack_fffffffffffffc28,other_00);
  if (bVar1) {
    JsonTest::TestResult::addFailure
              ((TestResult *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0),
               (char *)in_stack_fffffffffffffbe8,(uint)((ulong)in_stack_fffffffffffffbe0 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffbdf,
                                CONCAT16(in_stack_fffffffffffffbde,
                                         CONCAT24(in_stack_fffffffffffffbdc,
                                                  in_stack_fffffffffffffbd8))));
  }
  local_80 = in_RDI + 0x178;
  this_01 = *(Value **)(in_RDI + 8);
  Json::Value::Value(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbcc);
  expr = Json::Value::operator[](in_stack_fffffffffffffbe8,(char *)in_stack_fffffffffffffbe0);
  Json::Value::Value(this_01,in_stack_fffffffffffffc48);
  JsonTest::checkEqual<Json::Value,Json::Value>
            (in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,in_stack_fffffffffffffc70,in_RDI,
             line,(char *)expr);
  Json::Value::~Value(in_stack_fffffffffffffc00);
  Json::Value::~Value(in_stack_fffffffffffffc00);
  Json::Value::Value(in_stack_fffffffffffffbe0,
                     CONCAT13(in_stack_fffffffffffffbdf,
                              CONCAT12(in_stack_fffffffffffffbde,in_stack_fffffffffffffbdc)));
  other = Json::Value::operator[](in_stack_fffffffffffffbe8,(char *)in_stack_fffffffffffffbe0);
  Json::Value::Value(this_01,other);
  JsonTest::checkEqual<Json::Value,Json::Value>
            (in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,in_stack_fffffffffffffc70,in_RDI,
             line,(char *)expr);
  Json::Value::~Value(in_stack_fffffffffffffc00);
  Json::Value::~Value(in_stack_fffffffffffffc00);
  Json::Value::Value(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbcc);
  Json::Value::operator[]
            (in_stack_fffffffffffffbe0,
             (char *)CONCAT17(in_stack_fffffffffffffbdf,
                              CONCAT16(in_stack_fffffffffffffbde,
                                       CONCAT24(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8)
                                      )));
  Json::Value::Value(this_01,other);
  JsonTest::checkEqual<Json::Value,Json::Value>
            (in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,in_stack_fffffffffffffc70,in_RDI,
             line,(char *)expr);
  Json::Value::~Value(in_stack_fffffffffffffc00);
  Json::Value::~Value(in_stack_fffffffffffffc00);
  Json::Value::Value(in_stack_fffffffffffffbe0,
                     CONCAT13(in_stack_fffffffffffffbdf,
                              CONCAT12(in_stack_fffffffffffffbde,in_stack_fffffffffffffbdc)));
  Json::Value::operator[]
            (in_stack_fffffffffffffbe0,
             (char *)CONCAT17(in_stack_fffffffffffffbdf,
                              CONCAT16(in_stack_fffffffffffffbde,
                                       CONCAT24(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8)
                                      )));
  Json::Value::Value(this_01,other);
  JsonTest::checkEqual<Json::Value,Json::Value>
            (in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,in_stack_fffffffffffffc70,in_RDI,
             line,(char *)expr);
  Json::Value::~Value(in_stack_fffffffffffffc00);
  Json::Value::~Value(in_stack_fffffffffffffc00);
  Json::Value::Value(in_stack_fffffffffffffbe0,
                     (char *)CONCAT17(in_stack_fffffffffffffbdf,
                                      CONCAT16(in_stack_fffffffffffffbde,
                                               CONCAT24(in_stack_fffffffffffffbdc,
                                                        in_stack_fffffffffffffbd8))));
  Json::Value::operator[]
            (in_stack_fffffffffffffbe0,
             (char *)CONCAT17(in_stack_fffffffffffffbdf,
                              CONCAT16(in_stack_fffffffffffffbde,
                                       CONCAT24(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8)
                                      )));
  Json::Value::operator=
            (in_stack_fffffffffffffbd0,
             (Value *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
  Json::Value::~Value(in_stack_fffffffffffffc00);
  Json::Value::Value(in_stack_fffffffffffffbe0,
                     (char *)CONCAT17(in_stack_fffffffffffffbdf,
                                      CONCAT16(in_stack_fffffffffffffbde,
                                               CONCAT24(in_stack_fffffffffffffbdc,
                                                        in_stack_fffffffffffffbd8))));
  Json::Value::operator[]
            (in_stack_fffffffffffffbe0,
             (char *)CONCAT17(in_stack_fffffffffffffbdf,
                              CONCAT16(in_stack_fffffffffffffbde,
                                       CONCAT24(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8)
                                      )));
  Json::Value::Value(this_01,other);
  JsonTest::checkEqual<Json::Value,Json::Value>
            (in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,in_stack_fffffffffffffc70,in_RDI,
             line,(char *)expr);
  Json::Value::~Value(in_stack_fffffffffffffc00);
  Json::Value::~Value(in_stack_fffffffffffffc00);
  Json::Value::Value(in_stack_fffffffffffffbe0,
                     (char *)CONCAT17(in_stack_fffffffffffffbdf,
                                      CONCAT16(in_stack_fffffffffffffbde,
                                               CONCAT24(in_stack_fffffffffffffbdc,
                                                        in_stack_fffffffffffffbd8))));
  this_00 = Json::Value::operator[]
                      (in_stack_fffffffffffffbe0,
                       (char *)CONCAT17(in_stack_fffffffffffffbdf,
                                        CONCAT16(in_stack_fffffffffffffbde,
                                                 CONCAT24(in_stack_fffffffffffffbdc,
                                                          in_stack_fffffffffffffbd8))));
  Json::Value::Value(this_01,other);
  JsonTest::checkEqual<Json::Value,Json::Value>
            (in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,in_stack_fffffffffffffc70,in_RDI,
             line,(char *)expr);
  Json::Value::~Value(this_00);
  Json::Value::~Value(this_00);
  pcVar3 = local_2c0;
  Json::Value::Value(in_stack_fffffffffffffbe0,
                     CONCAT13(in_stack_fffffffffffffbdf,
                              CONCAT12(in_stack_fffffffffffffbde,in_stack_fffffffffffffbdc)));
  uVar2 = Json::Value::removeMember
                    ((Value *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0),pcVar3,
                     in_stack_fffffffffffffbe0);
  result = *(TestResult **)(in_RDI + 8);
  Json::Value::Value((Value *)result,
                     (char *)CONCAT17(in_stack_fffffffffffffbdf,
                                      CONCAT16(in_stack_fffffffffffffbde,
                                               CONCAT24(in_stack_fffffffffffffbdc,
                                                        in_stack_fffffffffffffbd8))));
  Json::Value::Value(this_01,other);
  JsonTest::checkEqual<Json::Value,Json::Value>
            (in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,in_stack_fffffffffffffc70,in_RDI,
             line,(char *)expr);
  Json::Value::~Value(this_00);
  Json::Value::~Value(this_00);
  JsonTest::checkEqual<bool,bool>
            (result,(bool)in_stack_fffffffffffffbdf,(bool)in_stack_fffffffffffffbde,
             (char *)in_stack_fffffffffffffbd0,in_stack_fffffffffffffbcc,(char *)0x145e03);
  Json::Value::Value((Value *)result,
                     (char *)CONCAT17(in_stack_fffffffffffffbdf,
                                      CONCAT16(in_stack_fffffffffffffbde,
                                               CONCAT24(in_stack_fffffffffffffbdc,
                                                        in_stack_fffffffffffffbd8))));
  Json::Value::operator=
            (in_stack_fffffffffffffbd0,
             (Value *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
  Json::Value::~Value(this_00);
  uVar2 = Json::Value::removeMember
                    ((Value *)CONCAT17(uVar2,in_stack_fffffffffffffbf0),pcVar3,(Value *)result);
  pcVar3 = *(char **)(in_RDI + 8);
  Json::Value::Value((Value *)result,
                     (char *)CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffffbde,
                                                     CONCAT24(in_stack_fffffffffffffbdc,
                                                              in_stack_fffffffffffffbd8))));
  Json::Value::Value(this_01,other);
  JsonTest::checkEqual<Json::Value,Json::Value>
            (in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,in_stack_fffffffffffffc70,in_RDI,
             line,(char *)expr);
  Json::Value::~Value(this_00);
  Json::Value::~Value(this_00);
  JsonTest::checkEqual<bool,bool>
            (result,(bool)uVar2,(bool)in_stack_fffffffffffffbde,pcVar3,in_stack_fffffffffffffbcc,
             (char *)0x145f30);
  Json::Value::~Value(this_00);
  return;
}

Assistant:

JSONTEST_FIXTURE(ValueTest, objects) {
  // Types
  IsCheck checks;
  checks.isObject_ = true;
  JSONTEST_ASSERT_PRED(checkIs(emptyObject_, checks));
  JSONTEST_ASSERT_PRED(checkIs(object1_, checks));

  JSONTEST_ASSERT_EQUAL(Json::objectValue, emptyObject_.type());

  // Empty object okay
  JSONTEST_ASSERT(emptyObject_.isConvertibleTo(Json::nullValue));

  // Non-empty object not okay
  JSONTEST_ASSERT(!object1_.isConvertibleTo(Json::nullValue));

  // Always okay
  JSONTEST_ASSERT(emptyObject_.isConvertibleTo(Json::objectValue));

  // Never okay
  JSONTEST_ASSERT(!emptyObject_.isConvertibleTo(Json::arrayValue));
  JSONTEST_ASSERT(!emptyObject_.isConvertibleTo(Json::intValue));
  JSONTEST_ASSERT(!emptyObject_.isConvertibleTo(Json::uintValue));
  JSONTEST_ASSERT(!emptyObject_.isConvertibleTo(Json::realValue));
  JSONTEST_ASSERT(!emptyObject_.isConvertibleTo(Json::booleanValue));
  JSONTEST_ASSERT(!emptyObject_.isConvertibleTo(Json::stringValue));

  // Access through const reference
  const Json::Value& constObject = object1_;

  JSONTEST_ASSERT_EQUAL(Json::Value(1234), constObject["id"]);
  JSONTEST_ASSERT_EQUAL(Json::Value(), constObject["unknown id"]);

  // Access through non-const reference
  JSONTEST_ASSERT_EQUAL(Json::Value(1234), object1_["id"]);
  JSONTEST_ASSERT_EQUAL(Json::Value(), object1_["unknown id"]);

  object1_["some other id"] = "foo";
  JSONTEST_ASSERT_EQUAL(Json::Value("foo"), object1_["some other id"]);
  JSONTEST_ASSERT_EQUAL(Json::Value("foo"), object1_["some other id"]);

  // Remove.
  Json::Value got;
  bool did;
  did = object1_.removeMember("some other id", &got);
  JSONTEST_ASSERT_EQUAL(Json::Value("foo"), got);
  JSONTEST_ASSERT_EQUAL(true, did);
  got = Json::Value("bar");
  did = object1_.removeMember("some other id", &got);
  JSONTEST_ASSERT_EQUAL(Json::Value("bar"), got);
  JSONTEST_ASSERT_EQUAL(false, did);
}